

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::Command::Reset(Command *this)

{
  pointer ppBVar1;
  Base **child;
  pointer ppBVar2;
  
  (this->super_Group).super_Base.matched = false;
  ppBVar1 = (this->super_Group).children.
            super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar2 = (this->super_Group).children.
                 super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppBVar2 != ppBVar1; ppBVar2 = ppBVar2 + 1) {
    (*(*ppBVar2)->_vptr_Base[0xe])();
  }
  this->selectedCommand = (Command *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->subparserProgramLine);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::_M_erase_at_end(&this->subparserDescription,
                    (this->subparserDescription).
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->subparserHasFlag = false;
  this->subparserHasPositional = false;
  this->subparserHasCommand = false;
  return;
}

Assistant:

virtual void Reset() noexcept override
            {
                Group::Reset();
                selectedCommand = nullptr;
                subparserProgramLine.clear();
                subparserDescription.clear();
                subparserHasFlag = false;
                subparserHasPositional = false;
                subparserHasCommand = false;
#ifdef ARGS_NOEXCEPT
                subparserError = Error::None;
#endif
            }